

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

timestamp_t __thiscall SpikesConsumer::getData(SpikesConsumer *this,spikePacket *packet)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  size_t sVar4;
  timestamp_t tVar5;
  
  (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
            (this,this->tempbuffer,this->tempbufsize);
  pbVar2 = this->tempbuffer;
  sVar4 = spikePacket::headersize();
  memcpy(packet,pbVar2,sVar4);
  pbVar2 = this->tempbuffer;
  sVar4 = spikePacket::headersize();
  iVar1 = *(int *)(pbVar2 + sVar4);
  pbVar2 = this->tempbuffer;
  sVar4 = spikePacket::headersize();
  std::vector<int2d,_std::allocator<int2d>_>::reserve(&packet->points,(long)iVar1);
  lVar3 = *(long *)&packet->points;
  if (*(long *)&packet->field_0x18 != lVar3) {
    *(long *)&packet->field_0x18 = lVar3;
  }
  std::vector<int2d,std::allocator<int2d>>::_M_range_insert<int2d*>
            ((vector<int2d,std::allocator<int2d>> *)&packet->points,lVar3,pbVar2 + sVar4 + 4,
             pbVar2 + (long)iVar1 * 4 + sVar4 + 4);
  tVar5._4_4_ = 0;
  tVar5.trodes_timestamp = packet->timestamp;
  tVar5.system_timestamp = (this->super_HFSubConsumer).lasttimestamp;
  return tVar5;
}

Assistant:

timestamp_t SpikesConsumer::getData(spikePacket* packet){
    //Can't just memcpy buffer into the packet, have to do it in chunks b/c of std::vector waveform
    //Get "header" info (ntrode, cluster, timestamp)
    readData(tempbuffer, tempbufsize);
    memcpy(packet, tempbuffer, spikePacket::headersize());
    //get waveform points
    int npoints = *(int*)(tempbuffer + spikePacket::headersize());
    int2d* ptr = (int2d*)(tempbuffer + spikePacket::headersize() + sizeof(int));
    packet->points.reserve(npoints);
    packet->points.clear();
    packet->points.insert(packet->points.end(), ptr, ptr+npoints);
    return {packet->timestamp, lastSysTimestamp()};
}